

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionCollector.cpp
# Opt level: O3

void __thiscall ApprovalTests::ExceptionCollector::~ExceptionCollector(ExceptionCollector *this)

{
  if ((this->exceptionMessages).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->exceptionMessages).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[64]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
               (char (*) [64])"ERROR: Calling code forgot to call exceptionCollector.release()");
  }
  release(this);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->exceptionMessages);
  return;
}

Assistant:

ExceptionCollector::~ExceptionCollector()
    {
        if (!exceptionMessages.empty())
        {
            exceptionMessages.emplace_back("ERROR: Calling code forgot to call "
                                           "exceptionCollector.release()");
        }
        release();
    }